

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BibIndexer.cpp
# Opt level: O1

void __thiscall BibIndexer::completeIndex(BibIndexer *this)

{
  TSNode rootNode_00;
  TSNode rootNode_01;
  TSTree *self;
  TSNode rootNode;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  TSTree *pTStack_18;
  
  clearCached(this);
  if (this->file == (File *)0x0) {
    __assert_fail("file != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/src/biber/BibIndexer.cpp"
                  ,0x52,"void BibIndexer::completeIndex()");
  }
  self = File::getParseTree(this->file);
  if (self != (TSTree *)0x0) {
    ts_tree_root_node(self);
    rootNode_00.context._8_8_ = uStack_28;
    rootNode_00.context._0_8_ = local_30;
    rootNode_00.id = (void *)local_20;
    rootNode_00.tree = pTStack_18;
    lintErrors(this,rootNode_00);
    rootNode_01.context._8_8_ = uStack_28;
    rootNode_01.context._0_8_ = local_30;
    rootNode_01.id = (void *)local_20;
    rootNode_01.tree = pTStack_18;
    lintFile(this,rootNode_01);
    publishErrors(this);
    return;
  }
  __assert_fail("tree != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/src/biber/BibIndexer.cpp"
                ,0x55,"void BibIndexer::completeIndex()");
}

Assistant:

void BibIndexer::completeIndex () {
    clearCached();
    assert (file != nullptr);

    const TSTree *tree = file->getParseTree();
    assert (tree != nullptr);

    TSNode rootNode = ts_tree_root_node(tree);

    lintErrors(rootNode);

    lintFile(rootNode);

    publishErrors();
}